

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Function::tokenize(Function *this,GeneratorState *state,TokenStream *str)

{
  bool bVar1;
  char *identifier;
  reference ppVVar2;
  TokenStream *pTVar3;
  Token local_a0;
  Token local_90;
  Variable **local_80;
  Token local_78;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_68;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_60;
  __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
  local_58;
  const_iterator i;
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  Function *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  VariableType::tokenizeShortType(&this->m_returnType,str);
  pTVar3 = local_20;
  identifier = (char *)std::__cxx11::string::c_str();
  Token::Token(&local_30,identifier);
  TokenStream::operator<<(pTVar3,&local_30);
  Token::~Token(&local_30);
  pTVar3 = local_20;
  Token::Token((Token *)&i,LEFT_PAREN);
  TokenStream::operator<<(pTVar3,(Token *)&i);
  Token::~Token((Token *)&i);
  local_58._M_current =
       (Variable **)
       std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(&this->m_parameters);
  while( true ) {
    local_60._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::end(&this->m_parameters);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    pTVar3 = local_20;
    if (!bVar1) break;
    local_68._M_current =
         (Variable **)
         std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::begin(&this->m_parameters);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_68);
    pTVar3 = local_20;
    if (bVar1) {
      Token::Token(&local_78,COMMA);
      TokenStream::operator<<(pTVar3,&local_78);
      Token::~Token(&local_78);
    }
    ppVVar2 = __gnu_cxx::
              __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
              ::operator*(&local_58);
    Variable::tokenizeDeclaration(*ppVVar2,(GeneratorState *)str_local,local_20);
    local_80 = (Variable **)
               __gnu_cxx::
               __normal_iterator<rsg::Variable_*const_*,_std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>_>
               ::operator++(&local_58,0);
  }
  Token::Token(&local_90,RIGHT_PAREN);
  pTVar3 = TokenStream::operator<<(pTVar3,&local_90);
  Token::Token(&local_a0,NEWLINE);
  TokenStream::operator<<(pTVar3,&local_a0);
  Token::~Token(&local_a0);
  Token::~Token(&local_90);
  BlockStatement::tokenize(&this->m_functionBlock,(GeneratorState *)str_local,local_20);
  return;
}

Assistant:

void Function::tokenize (GeneratorState& state, TokenStream& str) const
{
	// Return type
	m_returnType.tokenizeShortType(str);

	// Function name
	DE_ASSERT(m_name != "");
	str << Token(m_name.c_str());

	// Parameters
	str << Token::LEFT_PAREN;

	for (vector<Variable*>::const_iterator i = m_parameters.begin(); i != m_parameters.end(); i++)
	{
		if (i != m_parameters.begin())
			str << Token::COMMA;
		(*i)->tokenizeDeclaration(state, str);
	}

	str << Token::RIGHT_PAREN << Token::NEWLINE;

	// Tokenize body
	m_functionBlock.tokenize(state, str);
}